

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O0

shared_ptr<const_tchecker::lvalue_expression_t> __thiscall
tchecker::typed_int_to_clock_assign_statement_t::clock_ptr
          (typed_int_to_clock_assign_statement_t *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_tchecker::lvalue_expression_t> sVar1;
  typed_int_to_clock_assign_statement_t *this_local;
  
  this_local = this;
  typed_assign_statement_t::lvalue_ptr((typed_assign_statement_t *)&stack0xffffffffffffffd8);
  std::shared_ptr<tchecker::lvalue_expression_t_const>::
  shared_ptr<tchecker::typed_lvalue_expression_t_const,void>
            ((shared_ptr<tchecker::lvalue_expression_t_const> *)this,
             (shared_ptr<const_tchecker::typed_lvalue_expression_t> *)&stack0xffffffffffffffd8);
  std::shared_ptr<const_tchecker::typed_lvalue_expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_lvalue_expression_t> *)&stack0xffffffffffffffd8);
  sVar1.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_tchecker::lvalue_expression_t>)
         sVar1.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<tchecker::lvalue_expression_t const> typed_int_to_clock_assign_statement_t::clock_ptr() const
{
  return lvalue_ptr();
}